

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qundostack.cpp
# Opt level: O0

QString * __thiscall QUndoStack::redoText(QUndoStack *this)

{
  bool bVar1;
  QUndoStackPrivate *pQVar2;
  QList<QUndoCommand_*> *this_00;
  qsizetype qVar3;
  QString *in_RDI;
  QUndoStackPrivate *d;
  QUndoCommand *in_stack_ffffffffffffffc8;
  
  pQVar2 = d_func((QUndoStack *)0xa821c9);
  bVar1 = QList<QUndoCommand_*>::isEmpty((QList<QUndoCommand_*> *)0xa821df);
  if (bVar1) {
    this_00 = (QList<QUndoCommand_*> *)(long)pQVar2->index;
    qVar3 = QList<QUndoCommand_*>::size(&pQVar2->command_list);
    if ((long)this_00 < qVar3) {
      QList<QUndoCommand_*>::at(this_00,(qsizetype)in_stack_ffffffffffffffc8);
      QUndoCommand::actionText(in_stack_ffffffffffffffc8);
    }
    else {
      QString::QString((QString *)0xa8224e);
    }
  }
  else {
    QString::QString((QString *)0xa821ed);
  }
  return in_RDI;
}

Assistant:

QString QUndoStack::redoText() const
{
    Q_D(const QUndoStack);
    if (!d->macro_stack.isEmpty())
        return QString();
    if (d->index < d->command_list.size())
        return d->command_list.at(d->index)->actionText();
    return QString();
}